

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
std::
_Tuple_impl<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::_Ios_Openmode>_>
::_Tuple_impl(_Tuple_impl<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::_Ios_Openmode>_>
              *this,_Tuple_impl<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::_Ios_Openmode>_>
                    *param_2)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  VTable *pVVar3;
  
  (this->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
  super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
  super_MatcherBase<std::_Ios_Openmode>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00276078;
  pVVar1 = (param_2->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
           super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
           super_MatcherBase<std::_Ios_Openmode>.vtable_;
  (this->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
  super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
  super_MatcherBase<std::_Ios_Openmode>.vtable_ = pVVar1;
  (this->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
  super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
  super_MatcherBase<std::_Ios_Openmode>.buffer_ =
       (param_2->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
       super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
       super_MatcherBase<std::_Ios_Openmode>.buffer_;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
             super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
             super_MatcherBase<std::_Ios_Openmode>.buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
  super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
  super_MatcherBase<std::_Ios_Openmode>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00276008;
  (this->
  super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00275fd8;
  pVVar3 = (param_2->
           super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
           )._M_head_impl.
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           .vtable_;
  (this->
  super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .vtable_ = pVVar3;
  (this->
  super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .buffer_ = (param_2->
             super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
             )._M_head_impl.
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .buffer_;
  if ((pVVar3 != (VTable *)0x0) &&
     (pVVar3->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->
             super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
             )._M_head_impl.
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->
  super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00275f68;
  return;
}

Assistant:

MatcherBase(const MatcherBase& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    if (IsShared()) buffer_.shared->Ref();
  }